

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_uint64 ma_dr_wav_read_pcm_frames_s32(ma_dr_wav *pWav,ma_uint64 framesToRead,ma_int32 *pBufferOut)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  ma_uint64 mVar4;
  ulong uVar5;
  byte *pbVar6;
  ulong uVar7;
  uint shift;
  int iVar8;
  long lVar9;
  long lVar10;
  ma_int32 *pmVar11;
  ulong uVar12;
  ulong uVar13;
  undefined8 *puVar14;
  ulong uVar15;
  ulong uVar16;
  uint j;
  ma_uint64 totalFramesRead;
  ma_uint64 mVar17;
  ma_int16 samples16 [2048];
  undefined8 local_1038;
  
  if (framesToRead != 0 && pWav != (ma_dr_wav *)0x0) {
    if (pBufferOut == (ma_int32 *)0x0) {
      mVar17 = ma_dr_wav_read_pcm_frames(pWav,framesToRead,(void *)0x0);
      return mVar17;
    }
    uVar1 = pWav->translatedFormatTag;
    switch(uVar1) {
    case 1:
      memset(&local_1038,0,0x1000);
      if (pWav->bitsPerSample == 0x20) {
        mVar17 = ma_dr_wav_read_pcm_frames(pWav,framesToRead,pBufferOut);
        return mVar17;
      }
      if ((pWav->bitsPerSample & 7) == 0) {
        uVar3 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
      }
      else {
        uVar3 = (uint)(pWav->fmt).blockAlign;
      }
      if (((uVar1 & 0xfffe) != 6) || (uVar13 = 0, uVar3 == (pWav->fmt).channels)) {
        uVar13 = (ulong)uVar3;
      }
      if ((uint)uVar13 != 0) {
        uVar1 = pWav->channels;
        uVar5 = uVar13 / uVar1;
        if ((uint)uVar13 < (uint)uVar1) {
          return 0;
        }
        if ((int)(uVar13 % (ulong)uVar1) == 0) {
          uVar3 = (uint)uVar5;
          mVar17 = 0;
          do {
            if (framesToRead == 0) {
              return mVar17;
            }
            bVar2 = false;
            uVar12 = 0x1000 / uVar13;
            if (framesToRead < 0x1000 / uVar13) {
              uVar12 = framesToRead;
            }
            mVar4 = ma_dr_wav_read_pcm_frames(pWav,uVar12,&local_1038);
            if (mVar4 != 0) {
              uVar12 = pWav->channels * mVar4;
              if (uVar12 * uVar5 < 0x1001) {
                switch(uVar3) {
                case 1:
                  if (uVar12 != 0 && pBufferOut != (ma_int32 *)0x0) {
                    lVar9 = 0;
                    do {
                      pBufferOut[lVar9] =
                           (*(byte *)((long)&local_1038 + lVar9) ^ 0xffffff80) << 0x18;
                      lVar9 = lVar9 + 1;
                    } while (uVar12 - lVar9 != 0);
                  }
                  break;
                case 2:
                  if (uVar12 != 0 && pBufferOut != (ma_int32 *)0x0) {
                    lVar9 = 0;
                    do {
                      pBufferOut[lVar9] = (uint)*(ushort *)((long)&local_1038 + lVar9 * 2) << 0x10;
                      lVar9 = lVar9 + 1;
                    } while (uVar12 - lVar9 != 0);
                  }
                  break;
                case 3:
                  if (uVar12 != 0 && pBufferOut != (ma_int32 *)0x0) {
                    pbVar6 = (byte *)((long)&local_1038 + 2);
                    lVar9 = 0;
                    do {
                      pBufferOut[lVar9] =
                           (uint)*pbVar6 << 0x18 | (uint)pbVar6[-1] << 0x10 | (uint)pbVar6[-2] << 8;
                      lVar9 = lVar9 + 1;
                      pbVar6 = pbVar6 + 3;
                    } while (uVar12 - lVar9 != 0);
                  }
                  break;
                case 4:
                  if (uVar12 != 0) {
                    uVar7 = 0;
                    do {
                      pBufferOut[uVar7] = *(ma_int32 *)((long)&local_1038 + uVar7 * 4);
                      uVar7 = uVar7 + 1;
                    } while ((uVar7 & 0xffffffff) <= uVar12 && uVar12 - (uVar7 & 0xffffffff) != 0);
                  }
                  break;
                default:
                  if (uVar3 < 9) {
                    if (uVar12 != 0) {
                      uVar7 = 0;
                      puVar14 = &local_1038;
                      pmVar11 = pBufferOut;
                      do {
                        lVar9 = 0;
                        uVar15 = 0;
                        uVar16 = uVar5;
                        iVar8 = uVar3 * -8 + 0x40;
                        do {
                          uVar15 = uVar15 | (ulong)*(byte *)((long)puVar14 + lVar9) <<
                                            ((byte)iVar8 & 0x3f);
                          iVar8 = iVar8 + 8;
                          lVar9 = lVar9 + 1;
                          uVar16 = uVar16 - 1;
                        } while (uVar16 != 0);
                        puVar14 = (undefined8 *)((long)puVar14 + uVar5);
                        *pmVar11 = (ma_int32)(uVar15 >> 0x20);
                        pmVar11 = pmVar11 + 1;
                        uVar7 = (ulong)((int)uVar7 + 1);
                      } while (uVar7 <= uVar12 && uVar12 - uVar7 != 0);
                    }
                  }
                  else {
                    memset(pBufferOut,0,uVar12 * 4);
                  }
                }
                pBufferOut = pBufferOut + uVar12;
                framesToRead = framesToRead - mVar4;
                mVar17 = mVar17 + mVar4;
                bVar2 = true;
              }
              else {
                bVar2 = false;
              }
            }
          } while (bVar2);
          return mVar17;
        }
        return 0;
      }
      break;
    case 3:
      memset(&local_1038,0,0x1000);
      if ((pWav->bitsPerSample & 7) == 0) {
        uVar3 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
      }
      else {
        uVar3 = (uint)(pWav->fmt).blockAlign;
      }
      if (((uVar1 & 0xfffe) != 6) || (uVar13 = 0, uVar3 == (pWav->fmt).channels)) {
        uVar13 = (ulong)uVar3;
      }
      if ((uint)uVar13 != 0) {
        uVar1 = pWav->channels;
        uVar5 = uVar13 / uVar1;
        iVar8 = (int)uVar5;
        if ((uint)uVar13 < (uint)uVar1) {
          return 0;
        }
        if ((int)(uVar13 % (ulong)uVar1) == 0) {
          mVar17 = 0;
          do {
            if (framesToRead == 0) {
              return mVar17;
            }
            uVar12 = 0x1000 / uVar13;
            if (framesToRead < 0x1000 / uVar13) {
              uVar12 = framesToRead;
            }
            mVar4 = ma_dr_wav_read_pcm_frames(pWav,uVar12,&local_1038);
            if ((mVar4 == 0) || (lVar9 = pWav->channels * mVar4, 0x1000 < lVar9 * uVar5)) {
              bVar2 = false;
            }
            else {
              if (iVar8 == 8) {
                if (lVar9 != 0 && pBufferOut != (ma_int32 *)0x0) {
                  lVar10 = 0;
                  do {
                    pBufferOut[lVar10] = (int)((double)(&local_1038)[lVar10] * 2147483648.0);
                    lVar10 = lVar10 + 1;
                  } while (lVar9 - lVar10 != 0);
                }
              }
              else if (iVar8 == 4) {
                if (lVar9 != 0 && pBufferOut != (ma_int32 *)0x0) {
                  lVar10 = 0;
                  do {
                    pBufferOut[lVar10] =
                         (int)(*(float *)((long)&local_1038 + lVar10 * 4) * 2.1474836e+09);
                    lVar10 = lVar10 + 1;
                  } while (lVar9 - lVar10 != 0);
                }
              }
              else {
                memset(pBufferOut,0,lVar9 * 4);
              }
              pBufferOut = pBufferOut + lVar9;
              framesToRead = framesToRead - mVar4;
              mVar17 = mVar17 + mVar4;
              bVar2 = true;
            }
          } while (bVar2);
          return mVar17;
        }
        return 0;
      }
      break;
    case 4:
    case 5:
      break;
    case 6:
      memset(&local_1038,0,0x1000);
      if ((pWav->bitsPerSample & 7) == 0) {
        uVar3 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
      }
      else {
        uVar3 = (uint)(pWav->fmt).blockAlign;
      }
      if (((uVar1 & 0xfffe) != 6) || (uVar13 = 0, uVar3 == (pWav->fmt).channels)) {
        uVar13 = (ulong)uVar3;
      }
      if ((uint)uVar13 != 0) {
        uVar1 = pWav->channels;
        if ((uint)uVar13 < (uint)uVar1) {
          return 0;
        }
        if ((int)(uVar13 % (ulong)uVar1) == 0) {
          mVar17 = 0;
          do {
            if (framesToRead == 0) {
              return mVar17;
            }
            bVar2 = false;
            uVar5 = 0x1000 / uVar13;
            if (framesToRead < 0x1000 / uVar13) {
              uVar5 = framesToRead;
            }
            mVar4 = ma_dr_wav_read_pcm_frames(pWav,uVar5,&local_1038);
            if (mVar4 != 0) {
              lVar9 = pWav->channels * mVar4;
              if (lVar9 * (uVar13 / uVar1) < 0x1001) {
                if (lVar9 != 0 && pBufferOut != (ma_int32 *)0x0) {
                  lVar10 = 0;
                  do {
                    pBufferOut[lVar10] =
                         (uint)g_ma_dr_wavAlawTable[*(byte *)((long)&local_1038 + lVar10)] << 0x10;
                    lVar10 = lVar10 + 1;
                  } while (lVar9 - lVar10 != 0);
                }
                pBufferOut = pBufferOut + lVar9;
                framesToRead = framesToRead - mVar4;
                mVar17 = mVar17 + mVar4;
                bVar2 = true;
              }
              else {
                bVar2 = false;
              }
            }
          } while (bVar2);
          return mVar17;
        }
        return 0;
      }
      break;
    case 7:
      memset(&local_1038,0,0x1000);
      if ((pWav->bitsPerSample & 7) == 0) {
        uVar3 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
      }
      else {
        uVar3 = (uint)(pWav->fmt).blockAlign;
      }
      if (((uVar1 & 0xfffe) != 6) || (uVar13 = 0, uVar3 == (pWav->fmt).channels)) {
        uVar13 = (ulong)uVar3;
      }
      if ((uint)uVar13 != 0) {
        uVar1 = pWav->channels;
        if ((uint)uVar13 < (uint)uVar1) {
          return 0;
        }
        if ((int)(uVar13 % (ulong)uVar1) == 0) {
          mVar17 = 0;
          do {
            if (framesToRead == 0) {
              return mVar17;
            }
            bVar2 = false;
            uVar5 = 0x1000 / uVar13;
            if (framesToRead < 0x1000 / uVar13) {
              uVar5 = framesToRead;
            }
            mVar4 = ma_dr_wav_read_pcm_frames(pWav,uVar5,&local_1038);
            if (mVar4 != 0) {
              lVar9 = pWav->channels * mVar4;
              if (lVar9 * (uVar13 / uVar1) < 0x1001) {
                if (lVar9 != 0 && pBufferOut != (ma_int32 *)0x0) {
                  lVar10 = 0;
                  do {
                    pBufferOut[lVar10] =
                         (uint)g_ma_dr_wavMulawTable[*(byte *)((long)&local_1038 + lVar10)] << 0x10;
                    lVar10 = lVar10 + 1;
                  } while (lVar9 - lVar10 != 0);
                }
                pBufferOut = pBufferOut + lVar9;
                framesToRead = framesToRead - mVar4;
                mVar17 = mVar17 + mVar4;
                bVar2 = true;
              }
              else {
                bVar2 = false;
              }
            }
          } while (bVar2);
          return mVar17;
        }
        return 0;
      }
      break;
    default:
      if (uVar1 != 0x11) {
        return 0;
      }
    case 2:
      mVar17 = 0;
      do {
        if (framesToRead == 0) {
          return mVar17;
        }
        uVar13 = (ulong)(0x800 / pWav->channels);
        if (framesToRead < uVar13) {
          uVar13 = framesToRead;
        }
        mVar4 = ma_dr_wav_read_pcm_frames_s16(pWav,uVar13,(ma_int16 *)&local_1038);
        if (mVar4 != 0) {
          lVar9 = pWav->channels * mVar4;
          if (lVar9 != 0 && pBufferOut != (ma_int32 *)0x0) {
            lVar10 = 0;
            do {
              pBufferOut[lVar10] = (uint)*(ushort *)((long)&local_1038 + lVar10 * 2) << 0x10;
              lVar10 = lVar10 + 1;
            } while (lVar9 - lVar10 != 0);
          }
          pBufferOut = pBufferOut + lVar9;
          framesToRead = framesToRead - mVar4;
          mVar17 = mVar17 + mVar4;
        }
      } while (mVar4 != 0);
      return mVar17;
    }
  }
  return 0;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_read_pcm_frames_s32(ma_dr_wav* pWav, ma_uint64 framesToRead, ma_int32* pBufferOut)
{
    if (pWav == NULL || framesToRead == 0) {
        return 0;
    }
    if (pBufferOut == NULL) {
        return ma_dr_wav_read_pcm_frames(pWav, framesToRead, NULL);
    }
    if (framesToRead * pWav->channels * sizeof(ma_int32) > MA_SIZE_MAX) {
        framesToRead = MA_SIZE_MAX / sizeof(ma_int32) / pWav->channels;
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_PCM) {
        return ma_dr_wav_read_pcm_frames_s32__pcm(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_ADPCM || pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_DVI_ADPCM) {
        return ma_dr_wav_read_pcm_frames_s32__msadpcm_ima(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_IEEE_FLOAT) {
        return ma_dr_wav_read_pcm_frames_s32__ieee(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_ALAW) {
        return ma_dr_wav_read_pcm_frames_s32__alaw(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_MULAW) {
        return ma_dr_wav_read_pcm_frames_s32__mulaw(pWav, framesToRead, pBufferOut);
    }
    return 0;
}